

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall
InterpTest_HostFunc_PingPong_SameThread_Test::TestBody
          (InterpTest_HostFunc_PingPong_SameThread_Test *this)

{
  Store *this_00;
  size_t sVar1;
  Func *this_01;
  Thread *thread;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Result result;
  Values results;
  AssertHelper local_180;
  Values local_178;
  Ptr local_158;
  Result local_13c;
  RefVec local_138;
  RefPtr<wabt::interp::HostFunc> local_118;
  RefPtr<wabt::interp::Thread> local_100;
  Ptr local_e8;
  FuncType local_c8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_88;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_68;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_100.obj_ = (Thread *)operator_new(0x30);
  local_100.store_ = (Store *)&((local_100.obj_)->super_Object).host_info_;
  ((local_100.obj_)->super_Object)._vptr_Object = (_func_int **)0x16d736100;
  *(undefined8 *)&((local_100.obj_)->super_Object).kind_ = 0x7f017f0160010601;
  *(undefined8 *)&((local_100.obj_)->super_Object).finalizer_.super__Function_base._M_functor =
       0x660100010602;
  *(undefined8 *)
   ((long)&((local_100.obj_)->super_Object).finalizer_.super__Function_base._M_functor + 8) =
       0x101050700010203;
  ((local_100.obj_)->super_Object).finalizer_.super__Function_base._M_manager =
       (_Manager_type)0x9010b0a010067;
  ((local_100.obj_)->super_Object).finalizer_._M_invoker = (_Invoker_type)0xb00106a01410020;
  local_100.root_index_ = (Index)local_100.store_;
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100);
  if (local_100.obj_ != (Thread *)0x0) {
    operator_delete(local_100.obj_);
  }
  this_00 = &(this->super_InterpTest).store_;
  local_118.obj_ = (HostFunc *)0x80000000aaa;
  local_118.store_ = (Store *)0x0;
  wabt::interp::Store::
  Alloc<wabt::interp::Thread,wabt::interp::Store&,wabt::interp::Thread::Options_const&>
            (&local_100,this_00,this_00,(Options *)&local_118);
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->enum_ = I32;
  local_88.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_88.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_88.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_88.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
   super__Vector_impl_data._M_start)->enum_ = I32;
  local_c8.super_ExternType.kind = First;
  local_c8.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_002d0ad0;
  local_88.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_c8.params,&local_68);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_c8.results,&local_88);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc:353:21)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc:353:21)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  wabt::interp::Store::
  Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
            (&local_118,this_00,this_00,&local_c8,
             (function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
              *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  local_c8.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_002d0ad0;
  if (local_c8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  sVar1 = ((local_118.obj_)->super_Func).super_Extern.super_Object.self_.index;
  local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  (local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
   super__Vector_impl_data._M_start)->index = sVar1;
  local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
       super__Vector_impl_data._M_finish;
  InterpTest::Instantiate(&this->super_InterpTest,&local_138);
  if (local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.root_index_ = 0;
  local_e8.obj_ = (Trap *)0x0;
  local_e8.store_ = (Store *)0x0;
  InterpTest::GetFuncExport(&local_158,&this->super_InterpTest,0);
  thread = local_100.obj_;
  this_01 = (Func *)CONCAT71(local_158.obj_._1_7_,(char)local_158.obj_);
  local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
  local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
       _M_impl.super__Vector_impl_data._M_start + 1;
  ((local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start)->field_0).i32_ = 1;
  *(undefined8 *)
   ((long)&(local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
            _M_impl.super__Vector_impl_data._M_start)->field_0 + 0xc) = 0xffffffff00000000;
  *(undefined8 *)
   ((long)&((local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
             ._M_impl.super__Vector_impl_data._M_start)->field_0).ref_.index + 4) = 0;
  local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_13c = wabt::interp::Func::Call(this_01,thread,&local_178,(Values *)&local_138,&local_e8);
  if (local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (CONCAT71(local_158.obj_._1_7_,(char)local_158.obj_) != 0) {
    wabt::interp::Store::DeleteRoot(local_158.store_,local_158.root_index_);
  }
  local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_178.
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)&local_158,"Result::Ok","result",(Enum *)&local_178,&local_13c);
  if ((char)local_158.obj_ == '\0') {
    testing::Message::Message((Message *)&local_178);
    if (local_158.store_ == (Store *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)&(local_158.store_)->features_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0x175,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if (((local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      (**(code **)(((local_178.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_start)->field_0).i64_ + 8))();
    }
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_158.store_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_180.data_._0_4_ = 1;
    local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(((long)local_138.
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_138.
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&local_158,"1u","results.size()",(uint *)&local_180,
               (unsigned_long *)&local_178);
    if ((char)local_158.obj_ == '\0') {
      testing::Message::Message((Message *)&local_178);
      if (local_158.store_ == (Store *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)&(local_158.store_)->features_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
                 ,0x176,pcVar3);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      if (((local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((local_178.
                       super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0).i64_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_158.store_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_178.
                           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0xb);
    if (1 < (int)local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].index + 1U) {
      __assert_fail("t == type || type == ValueType::Any",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp.h"
                    ,0x22d,"void wabt::interp::Value::CheckType(ValueType) const");
    }
    local_180.data_._0_4_ =
         (undefined4)
         (local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
          _M_impl.super__Vector_impl_data._M_start)->index;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&local_158,"11u","results[0].Get<u32>()",(uint *)&local_178,
               (uint *)&local_180);
    if ((char)local_158.obj_ == '\0') {
      testing::Message::Message((Message *)&local_178);
      if (local_158.store_ == (Store *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)&(local_158.store_)->features_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
                 ,0x177,pcVar3);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      if (((local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_178.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((local_178.
                       super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0).i64_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_158.store_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_e8.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_e8.store_,local_e8.root_index_);
  }
  if (local_138.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.obj_ != (HostFunc *)0x0) {
    wabt::interp::Store::DeleteRoot(local_118.store_,local_118.root_index_);
  }
  if (local_100.obj_ != (Thread *)0x0) {
    wabt::interp::Store::DeleteRoot(local_100.store_,local_100.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpTest, HostFunc_PingPong_SameThread) {
  // (import "" "f" (func $f (param i32) (result i32)))
  // (func (export "g") (param i32) (result i32)
  //   (call $f (i32.add (local.get 0) (i32.const 1))))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x06, 0x01, 0x60,
      0x01, 0x7f, 0x01, 0x7f, 0x02, 0x06, 0x01, 0x00, 0x01, 0x66, 0x00, 0x00,
      0x03, 0x02, 0x01, 0x00, 0x07, 0x05, 0x01, 0x01, 0x67, 0x00, 0x01, 0x0a,
      0x0b, 0x01, 0x09, 0x00, 0x20, 0x00, 0x41, 0x01, 0x6a, 0x10, 0x00, 0x0b,
  });

  auto thread = Thread::New(store_, {});

  auto host_func =
      HostFunc::New(store_, FuncType{{ValueType::I32}, {ValueType::I32}},
                    [&](Thread& t, const Values& params, Values& results,
                        Trap::Ptr* out_trap) -> Result {
                      auto val = params[0].Get<u32>();
                      if (val < 10) {
                        return GetFuncExport(0)->Call(t, {Value::Make(val * 2)},
                                                      results, out_trap);
                      }
                      results[0] = Value::Make(val);
                      return Result::Ok;
                    });

  Instantiate({host_func->self()});

  // Should produce the following calls:
  //  g(1) -> f(2) -> g(4) -> f(5) -> g(10) -> f(11) -> return 11

  Values results;
  Trap::Ptr trap;
  Result result = GetFuncExport(0)->Call(*thread, {Value::Make(1)}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(11u, results[0].Get<u32>());
}